

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O2

void Rwr_ManIncTravId(Rwr_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  int i;
  
  uVar1 = p->nTravIds;
  p->nTravIds = uVar1 + 1;
  if (0x8ffffffe < uVar1) {
    for (i = 0; i < p->vForest->nSize; i = i + 1) {
      pvVar2 = Vec_PtrEntry(p->vForest,i);
      *(undefined4 *)((long)pvVar2 + 4) = 0;
    }
    p->nTravIds = 1;
  }
  return;
}

Assistant:

void Rwr_ManIncTravId( Rwr_Man_t * p )
{
    Rwr_Node_t * pNode;
    int i;
    if ( p->nTravIds++ < 0x8FFFFFFF )
        return;
    Vec_PtrForEachEntry( Rwr_Node_t *, p->vForest, pNode, i )
        pNode->TravId = 0;
    p->nTravIds = 1;
}